

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall rsg::AssignOp::evaluate(AssignOp *this,ExecutionContext *evalCtx)

{
  ValueRange *this_00;
  pointer pSVar1;
  int iVar2;
  undefined4 extraout_var;
  void *__src;
  Scalar *extraout_RDX;
  ExecConstValueAccess mask;
  ExecConstValueAccess src;
  ExecValueAccess dst;
  
  (*this->m_lvalueExpr->_vptr_Expression[4])();
  (*this->m_rvalueExpr->_vptr_Expression[4])(this->m_rvalueExpr,evalCtx);
  this_00 = &this->m_valueRange;
  iVar2 = VariableType::getScalarSize(&this_00->m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->m_value).m_value,(long)(iVar2 << 6));
  (*this->m_rvalueExpr->_vptr_Expression[5])();
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar2 = VariableType::getScalarSize(&this_00->m_type);
  if ((iVar2 != 0) && (iVar2 << 6 != 0)) {
    memmove(pSVar1,__src,(long)(iVar2 << 6) << 2);
  }
  iVar2 = (*this->m_lvalueExpr->_vptr_Expression[6])();
  dst.super_ConstStridedValueAccess<64>.m_type._4_4_ = extraout_var;
  dst.super_ConstStridedValueAccess<64>.m_type._0_4_ = iVar2;
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  mask = ExecutionContext::getExecutionMask(evalCtx);
  src.m_value = pSVar1;
  src.m_type = &this_00->m_type;
  dst.super_ConstStridedValueAccess<64>.m_value = extraout_RDX;
  assignMasked(dst,src,mask);
  return;
}

Assistant:

void AssignOp::evaluate (ExecutionContext& evalCtx)
{
	// Evaluate l-value
	m_lvalueExpr->evaluate(evalCtx);

	// Evaluate value
	m_rvalueExpr->evaluate(evalCtx);
	m_value.setStorage(m_valueRange.getType());
	m_value.getValue(m_valueRange.getType()) = m_rvalueExpr->getValue().value();

	// Assign
	assignMasked(m_lvalueExpr->getLValue(), m_value.getValue(m_valueRange.getType()), evalCtx.getExecutionMask());
}